

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O3

quaternion * quaternion_rotate_by_euler_angles_EXP(quaternion *self,float ax,float ay,float az)

{
  quaternion qT;
  quaternion local_20;
  
  quaternion_set_from_euler_anglesf3(&local_20,ax,ay,az);
  quaternion_multiply(self,&local_20);
  quaternion_normalize(self);
  return self;
}

Assistant:

HYPAPI struct quaternion *quaternion_rotate_by_euler_angles_EXP(struct quaternion *self, HYP_FLOAT ax, HYP_FLOAT ay, HYP_FLOAT az)
{
	struct quaternion qT;

	/* make a quaternion from the eulers */
	quaternion_set_from_euler_anglesf3(&qT, ax, ay, az);

	/* rotate the quaternion by it */
	quaternion_rotate_by_quaternion_EXP(self, &qT);

	return self;
}